

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O0

matrixOps * __thiscall
pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,double,double>
          (matrixOps *this,Mat *img,Mat *kernel,double accumulatorInit,
          function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
          *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                   *applicator)

{
  anon_class_96_12_04f0a8a3 local_d8;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_78;
  uint local_54;
  uint local_50;
  uint kernelOffsetX;
  uint kernelOffsetY;
  uint endCol;
  uint endRow;
  uint initCol;
  uint initRow;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
  *applicator_local;
  function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
  *reducer_local;
  double accumulatorInit_local;
  Mat *kernel_local;
  Mat *img_local;
  Mat *resultImg;
  
  initCol._3_1_ = 0;
  _initRow = applicator;
  applicator_local =
       (function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
        *)reducer;
  reducer_local =
       (function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
        *)accumulatorInit;
  accumulatorInit_local = (double)kernel;
  kernel_local = img;
  img_local = (Mat *)this;
  cv::Mat::clone();
  endRow = (*(int *)((long)accumulatorInit_local + 8) + -1) -
           (*(int *)((long)accumulatorInit_local + 8) + -1 >> 0x1f) >> 1;
  endCol = (*(int *)((long)accumulatorInit_local + 0xc) + -1) -
           (*(int *)((long)accumulatorInit_local + 0xc) + -1 >> 0x1f) >> 1;
  kernelOffsetY = ~endRow + *(int *)(kernel_local + 8);
  kernelOffsetX = ~endCol + *(int *)(kernel_local + 0xc);
  local_50 = (*(int *)((long)accumulatorInit_local + 8) + -1) -
             (*(int *)((long)accumulatorInit_local + 8) + -1 >> 0x1f) >> 1;
  local_54 = (*(int *)((long)accumulatorInit_local + 0xc) + -1) -
             (*(int *)((long)accumulatorInit_local + 0xc) + -1 >> 0x1f) >> 1;
  local_d8.initCol = &endCol;
  local_d8.initRow = &endRow;
  local_d8.endCol = &kernelOffsetX;
  local_d8.endRow = &kernelOffsetY;
  local_d8.kernel = (Mat *)accumulatorInit_local;
  local_d8.accumulatorInit = (double *)&reducer_local;
  local_d8.img = kernel_local;
  local_d8.kernelOffsetY = &local_50;
  local_d8.kernelOffsetX = &local_54;
  local_d8.reducer =
       (function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
        *)applicator_local;
  local_d8.applicator = _initRow;
  local_d8.resultImg = (Mat *)this;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,double,double>(cv::Mat_const&,cv::Mat_const&,double,std::function<double(unsigned_long_const&,unsigned_long_const&,double&,cv::Vec<unsigned_char,3>const&,double_const&)>const&,std::function<void(unsigned_long_const&,unsigned_long_const&,double&,cv::Vec<unsigned_char,3>&,cv::Mat_const&)>const&)::_lambda(unsigned_long_const&,unsigned_long_const&)_1_,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_78,&local_d8);
  forEachPixel((Mat *)this,&local_78);
  std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::~function(&local_78);
  return this;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}